

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O0

int Aig_ObjReverseLevelNew(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  int b;
  int local_38;
  int local_30;
  int Level;
  int LevelCur;
  int iFanout;
  int i;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  Level = -1;
  local_30 = 0;
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTiming.c"
                  ,0x79,"int Aig_ObjReverseLevelNew(Aig_Man_t *, Aig_Obj_t *)");
  }
  LevelCur = 0;
  while( true ) {
    bVar1 = false;
    if (LevelCur < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
      if (LevelCur == 0) {
        local_38 = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        local_38 = Aig_ObjFanoutNext(p,Level);
      }
      Level = local_38;
      _iFanout = Aig_ManObj(p,local_38 >> 1);
      bVar1 = true;
    }
    if (!bVar1) break;
    b = Aig_ObjReverseLevel(p,_iFanout);
    local_30 = Abc_MaxInt(local_30,b);
    LevelCur = LevelCur + 1;
  }
  return local_30 + 1;
}

Assistant:

int Aig_ObjReverseLevelNew( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1, LevelCur, Level = 0;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
    {
        LevelCur = Aig_ObjReverseLevel( p, pFanout );
        Level = Abc_MaxInt( Level, LevelCur );
    }
    return Level + 1;
}